

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

ArchType parseBPFArch(StringRef ArchName)

{
  uint uVar1;
  ArchType AVar2;
  ushort uVar3;
  size_t sVar4;
  uint *puVar5;
  bool bVar6;
  
  sVar4 = ArchName.Length;
  puVar5 = (uint *)ArchName.Data;
  if (sVar4 == 6) {
    if ((short)puVar5[1] == 0x6562 && *puVar5 == 0x5f667062) {
      return bpfeb;
    }
    uVar1 = *puVar5 ^ 0x5f667062;
    uVar3 = (ushort)puVar5[1] ^ 0x656c;
  }
  else {
    if (sVar4 != 5) {
      if (sVar4 != 3) {
        return UnknownArch;
      }
      bVar6 = *(char *)((long)puVar5 + 2) == 'f' && (short)*puVar5 == 0x7062;
      goto LAB_0012ee18;
    }
    if ((char)puVar5[1] == 'b' && *puVar5 == 0x65667062) {
      return bpfeb;
    }
    uVar1 = *puVar5 ^ 0x65667062;
    uVar3 = (byte)puVar5[1] ^ 0x6c;
  }
  bVar6 = uVar3 == 0 && uVar1 == 0;
LAB_0012ee18:
  AVar2 = bpfel;
  if (!bVar6) {
    AVar2 = UnknownArch;
  }
  return AVar2;
}

Assistant:

bool equals(StringRef RHS) const {
      return (Length == RHS.Length &&
              compareMemory(Data, RHS.Data, RHS.Length) == 0);
    }